

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

void __thiscall setup::directory_entry::load(directory_entry *this,istream *is,info *i)

{
  short sVar1;
  uint16_t uVar2;
  uint uVar3;
  flag_type fVar4;
  flag_type fVar5;
  flag_type fVar6;
  int_adapter<unsigned_int> *in_RDX;
  istream *in_RSI;
  long in_RDI;
  info *in_stack_00000040;
  istream *in_stack_00000048;
  item *in_stack_00000050;
  stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_0,_16UL>
  *in_stack_00000148;
  istream *in_stack_ffffffffffffff78;
  istream *in_stack_ffffffffffffff80;
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_38 [8];
  encoded_string local_30;
  int_adapter<unsigned_int> *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x1030000) {
    util::load<unsigned_int>((istream *)0x16e181);
  }
  util::encoded_string::encoded_string
            (&local_30,(string *)(in_RDI + 0x100),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_stack_ffffffffffffff80,(encoded_string *)in_stack_ffffffffffffff78);
  item::load_condition_data(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((uVar3 < 0x4000b00) ||
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), 0x400ffff < uVar3))
  {
    std::__cxx11::string::clear();
  }
  else {
    boost::unordered::iterator_detail::
    iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
              (local_38,(slice_reader *)(in_RDI + 0x120));
    util::operator>>(local_10,(binary_string *)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff80 = local_10;
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x2000b00) {
    *(undefined4 *)(in_RDI + 0x140) = 0;
  }
  else {
    uVar3 = util::load<unsigned_int>((istream *)0x16e25b);
    *(uint *)(in_RDI + 0x140) = uVar3;
  }
  item::load_version_data
            ((item *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(version *)0x16e28d);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x4010000) {
    *(undefined2 *)(in_RDI + 0x144) = 0xffff;
  }
  else {
    sVar1 = util::load<short>((istream *)0x16e2a8);
    *(short *)(in_RDI + 0x144) = sVar1;
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x5020000) {
    uVar2 = setup::version::bits((version *)in_stack_ffffffffffffff80);
    if (uVar2 == 0x10) {
      stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_0,_16UL>::
      stored_flags((stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_0,_16UL>
                    *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      fVar6 = stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_0,_16UL>::get
                        (in_stack_00000148);
      ((Type *)(in_RDI + 0x148))->super__Base_bitset<1UL> =
           (_Base_bitset<1UL>)fVar6._flags.super__Base_bitset<1UL>._M_w;
    }
    else {
      stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_0,_32UL>::
      stored_flags((stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_0,_32UL>
                    *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      fVar5 = stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_0,_32UL>::get
                        ((stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_0,_32UL>
                          *)in_stack_00000148);
      ((Type *)(in_RDI + 0x148))->super__Base_bitset<1UL> =
           (_Base_bitset<1UL>)fVar5._flags.super__Base_bitset<1UL>._M_w;
    }
  }
  else {
    stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_1,_32UL>::stored_flags
              ((stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_1,_32UL> *)
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    fVar4 = stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_1,_32UL>::get
                      ((stored_flags<setup::(anonymous_namespace)::stored_inno_directory_options_1,_32UL>
                        *)in_stack_00000148);
    ((Type *)(in_RDI + 0x148))->super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)fVar4._flags.super__Base_bitset<1UL>._M_w;
  }
  return;
}

Assistant:

void directory_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	
	load_condition_data(is, i);
	
	if(i.version >= INNO_VERSION(4, 0, 11) && i.version < INNO_VERSION(4, 1, 0)) {
		is >> util::binary_string(permissions);
	} else {
		permissions.clear();
	}
	
	if(i.version >= INNO_VERSION(2, 0, 11)) {
		attributes = util::load<boost::uint32_t>(is);
	} else {
		attributes = 0;
	}
	
	load_version_data(is, i.version);
	
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		permission = util::load<boost::int16_t>(is);
	} else {
		permission = boost::int16_t(-1);
	}
	
	if(i.version >= INNO_VERSION(5, 2, 0)) {
		options = stored_flags<stored_inno_directory_options_1>(is).get();
	} else if(i.version.bits() != 16) {
		options = stored_flags<stored_inno_directory_options_0>(is).get();
	} else {
		options = stored_flags<stored_inno_directory_options_0, 16>(is).get();
	}
	
}